

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

int AF_AActor_GiveInventoryType
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  bool bVar1;
  AInventory *val;
  int iVar2;
  char *pcVar3;
  AActor *this;
  PClassActor *type;
  
  if (numparam < 1) {
    pcVar3 = "(paramnum) < numparam";
    goto LAB_00431440;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_00431427:
    pcVar3 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_00431440:
    __assert_fail(pcVar3,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x463,
                  "int AF_AActor_GiveInventoryType(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  this = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (AActor *)0x0) goto LAB_004313a9;
    bVar1 = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
    if (!bVar1) {
      pcVar3 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_00431440;
    }
  }
  else {
    if (this != (AActor *)0x0) goto LAB_00431427;
LAB_004313a9:
    this = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar3 = "(paramnum) < numparam";
    goto LAB_0043145f;
  }
  if (param[1].field_0.field_3.Type == '\x03') {
    type = (PClassActor *)param[1].field_0.field_1.a;
    if (param[1].field_0.field_1.atag == 1) {
      if (type != (PClassActor *)0x0) {
        bVar1 = PClass::IsAncestorOf(AInventory::RegistrationInfo.MyClass,(PClass *)type);
        if (!bVar1) {
          pcVar3 = "type == NULL || type->IsDescendantOf(RUNTIME_CLASS(AInventory))";
          goto LAB_0043145f;
        }
        goto LAB_004313f4;
      }
    }
    else if (type != (PClassActor *)0x0) goto LAB_00431430;
    type = (PClassActor *)0x0;
LAB_004313f4:
    val = AActor::GiveInventoryType(this,type);
    if (numret < 1) {
      iVar2 = 0;
    }
    else {
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                      ,0x465,
                      "int AF_AActor_GiveInventoryType(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      iVar2 = 1;
      VMReturn::SetPointer(ret,val,1);
    }
    return iVar2;
  }
LAB_00431430:
  pcVar3 = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0043145f:
  __assert_fail(pcVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x464,
                "int AF_AActor_GiveInventoryType(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, GiveInventoryType)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_CLASS(type, AInventory);
	ACTION_RETURN_OBJECT(self->GiveInventoryType(type));
}